

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkClass.hpp
# Opt level: O3

void __thiscall
benchmarks::BenchmarksClass::AddBenchmark<long,void(*)(benchmarks::BenchmarkContext&,long)>
          (BenchmarksClass *this,string *name,_func_void_BenchmarkContext_ptr_long *benchmarkFunc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *orderedParamNames)

{
  undefined1 local_39;
  Benchmark<long> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<benchmarks::IBenchmark> local_28;
  _func_void_BenchmarkContext_ptr_long *local_18;
  
  local_38 = (Benchmark<long> *)0x0;
  local_18 = benchmarkFunc;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<benchmarks::Benchmark<long>,std::allocator<benchmarks::Benchmark<long>>,std::__cxx11::string,void(*)(benchmarks::BenchmarkContext&,long),std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&_Stack_30,&local_38,(allocator<benchmarks::Benchmark<long>_> *)&local_39,name,
             &local_18,orderedParamNames);
  local_28.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_IBenchmark;
  local_28.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_30._M_pi;
  local_38 = (Benchmark<long> *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,std::allocator<std::shared_ptr<benchmarks::IBenchmark>>>
  ::emplace_back<std::shared_ptr<benchmarks::IBenchmark>>
            ((vector<std::shared_ptr<benchmarks::IBenchmark>,std::allocator<std::shared_ptr<benchmarks::IBenchmark>>>
              *)&this->_benchmarks,&local_28);
  if (local_28.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

void AddBenchmark(std::string name, Functor_ benchmarkFunc, std::vector<std::string> orderedParamNames = {})
		{ _benchmarks.push_back(std::make_shared<Benchmark<BenchmarkParams_...>>(std::move(name), std::move(benchmarkFunc), std::move(orderedParamNames))); }